

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LayerParameter::LayerParameter(LayerParameter *this,LayerParameter *from)

{
  bool bVar1;
  InternalMetadataWithArena *this_00;
  string *psVar2;
  TransformationParameter *this_01;
  LossParameter *this_02;
  AccuracyParameter *this_03;
  ArgMaxParameter *this_04;
  ConcatParameter *this_05;
  ContrastiveLossParameter *this_06;
  ConvolutionParameter *this_07;
  DataParameter *this_08;
  DropoutParameter *this_09;
  DummyDataParameter *this_10;
  EltwiseParameter *this_11;
  ExpParameter *this_12;
  HDF5DataParameter *this_13;
  HDF5OutputParameter *this_14;
  HingeLossParameter *this_15;
  ImageDataParameter *this_16;
  InfogainLossParameter *this_17;
  InnerProductParameter *this_18;
  LRNParameter *this_19;
  MemoryDataParameter *this_20;
  MVNParameter *this_21;
  PoolingParameter *this_22;
  PowerParameter *this_23;
  ReLUParameter *this_24;
  SigmoidParameter *this_25;
  SoftmaxParameter *this_26;
  SliceParameter *this_27;
  TanHParameter *this_28;
  ThresholdParameter *this_29;
  WindowDataParameter *this_30;
  PythonParameter *this_31;
  PReLUParameter *this_32;
  SPPParameter *this_33;
  ReshapeParameter *this_34;
  LogParameter *this_35;
  FlattenParameter *this_36;
  ReductionParameter *this_37;
  EmbedParameter *this_38;
  TileParameter *this_39;
  BatchNormParameter *this_40;
  ELUParameter *this_41;
  BiasParameter *this_42;
  ScaleParameter *this_43;
  InputParameter *this_44;
  CropParameter *this_45;
  ParameterParameter *this_46;
  RecurrentParameter *this_47;
  LayerParameter *from_local;
  LayerParameter *this_local;
  Container *local_28;
  
  google::protobuf::Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__LayerParameter_00d4e0c0;
  google::protobuf::internal::InternalMetadataWithArena::InternalMetadataWithArena
            (&this->_internal_metadata_,(Arena *)0x0);
  *(undefined8 *)(this->_has_bits_).has_bits_ = *(undefined8 *)(from->_has_bits_).has_bits_;
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->bottom_,&from->bottom_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::RepeatedPtrField(&this->top_,&from->top_);
  google::protobuf::RepeatedField<float>::RepeatedField(&this->loss_weight_,&from->loss_weight_);
  google::protobuf::RepeatedPtrField<caffe::ParamSpec>::RepeatedPtrField
            (&this->param_,&from->param_);
  google::protobuf::RepeatedPtrField<caffe::BlobProto>::RepeatedPtrField
            (&this->blobs_,&from->blobs_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField
            (&this->include_,&from->include_);
  google::protobuf::RepeatedPtrField<caffe::NetStateRule>::RepeatedPtrField
            (&this->exclude_,&from->exclude_);
  google::protobuf::RepeatedField<bool>::RepeatedField
            (&this->propagate_down_,&from->propagate_down_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_00);
    }
    else {
      local_28 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArena::default_instance();
    }
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,&local_28->unknown_fields);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->name_,psVar2);
  bVar1 = has_name(from);
  if (bVar1) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,psVar2,(from->name_).ptr_);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->type_,psVar2);
  bVar1 = has_type(from);
  if (bVar1) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->type_,psVar2,(from->type_).ptr_);
  }
  bVar1 = has_transform_param(from);
  if (bVar1) {
    this_01 = (TransformationParameter *)operator_new(0x40);
    TransformationParameter::TransformationParameter(this_01,from->transform_param_);
    this->transform_param_ = this_01;
  }
  else {
    this->transform_param_ = (TransformationParameter *)0x0;
  }
  bVar1 = has_loss_param(from);
  if (bVar1) {
    this_02 = (LossParameter *)operator_new(0x28);
    LossParameter::LossParameter(this_02,from->loss_param_);
    this->loss_param_ = this_02;
  }
  else {
    this->loss_param_ = (LossParameter *)0x0;
  }
  bVar1 = has_accuracy_param(from);
  if (bVar1) {
    this_03 = (AccuracyParameter *)operator_new(0x28);
    AccuracyParameter::AccuracyParameter(this_03,from->accuracy_param_);
    this->accuracy_param_ = this_03;
  }
  else {
    this->accuracy_param_ = (AccuracyParameter *)0x0;
  }
  bVar1 = has_argmax_param(from);
  if (bVar1) {
    this_04 = (ArgMaxParameter *)operator_new(0x28);
    ArgMaxParameter::ArgMaxParameter(this_04,from->argmax_param_);
    this->argmax_param_ = this_04;
  }
  else {
    this->argmax_param_ = (ArgMaxParameter *)0x0;
  }
  bVar1 = has_concat_param(from);
  if (bVar1) {
    this_05 = (ConcatParameter *)operator_new(0x20);
    ConcatParameter::ConcatParameter(this_05,from->concat_param_);
    this->concat_param_ = this_05;
  }
  else {
    this->concat_param_ = (ConcatParameter *)0x0;
  }
  bVar1 = has_contrastive_loss_param(from);
  if (bVar1) {
    this_06 = (ContrastiveLossParameter *)operator_new(0x20);
    ContrastiveLossParameter::ContrastiveLossParameter(this_06,from->contrastive_loss_param_);
    this->contrastive_loss_param_ = this_06;
  }
  else {
    this->contrastive_loss_param_ = (ContrastiveLossParameter *)0x0;
  }
  bVar1 = has_convolution_param(from);
  if (bVar1) {
    this_07 = (ConvolutionParameter *)operator_new(0x98);
    ConvolutionParameter::ConvolutionParameter(this_07,from->convolution_param_);
    this->convolution_param_ = this_07;
  }
  else {
    this->convolution_param_ = (ConvolutionParameter *)0x0;
  }
  bVar1 = has_data_param(from);
  if (bVar1) {
    this_08 = (DataParameter *)operator_new(0x48);
    DataParameter::DataParameter(this_08,from->data_param_);
    this->data_param_ = this_08;
  }
  else {
    this->data_param_ = (DataParameter *)0x0;
  }
  bVar1 = has_dropout_param(from);
  if (bVar1) {
    this_09 = (DropoutParameter *)operator_new(0x20);
    DropoutParameter::DropoutParameter(this_09,from->dropout_param_);
    this->dropout_param_ = this_09;
  }
  else {
    this->dropout_param_ = (DropoutParameter *)0x0;
  }
  bVar1 = has_dummy_data_param(from);
  if (bVar1) {
    this_10 = (DummyDataParameter *)operator_new(0x88);
    DummyDataParameter::DummyDataParameter(this_10,from->dummy_data_param_);
    this->dummy_data_param_ = this_10;
  }
  else {
    this->dummy_data_param_ = (DummyDataParameter *)0x0;
  }
  bVar1 = has_eltwise_param(from);
  if (bVar1) {
    this_11 = (EltwiseParameter *)operator_new(0x30);
    EltwiseParameter::EltwiseParameter(this_11,from->eltwise_param_);
    this->eltwise_param_ = this_11;
  }
  else {
    this->eltwise_param_ = (EltwiseParameter *)0x0;
  }
  bVar1 = has_exp_param(from);
  if (bVar1) {
    this_12 = (ExpParameter *)operator_new(0x28);
    ExpParameter::ExpParameter(this_12,from->exp_param_);
    this->exp_param_ = this_12;
  }
  else {
    this->exp_param_ = (ExpParameter *)0x0;
  }
  bVar1 = has_hdf5_data_param(from);
  if (bVar1) {
    this_13 = (HDF5DataParameter *)operator_new(0x28);
    HDF5DataParameter::HDF5DataParameter(this_13,from->hdf5_data_param_);
    this->hdf5_data_param_ = this_13;
  }
  else {
    this->hdf5_data_param_ = (HDF5DataParameter *)0x0;
  }
  bVar1 = has_hdf5_output_param(from);
  if (bVar1) {
    this_14 = (HDF5OutputParameter *)operator_new(0x20);
    HDF5OutputParameter::HDF5OutputParameter(this_14,from->hdf5_output_param_);
    this->hdf5_output_param_ = this_14;
  }
  else {
    this->hdf5_output_param_ = (HDF5OutputParameter *)0x0;
  }
  bVar1 = has_hinge_loss_param(from);
  if (bVar1) {
    this_15 = (HingeLossParameter *)operator_new(0x20);
    HingeLossParameter::HingeLossParameter(this_15,from->hinge_loss_param_);
    this->hinge_loss_param_ = this_15;
  }
  else {
    this->hinge_loss_param_ = (HingeLossParameter *)0x0;
  }
  bVar1 = has_image_data_param(from);
  if (bVar1) {
    this_16 = (ImageDataParameter *)operator_new(0x50);
    ImageDataParameter::ImageDataParameter(this_16,from->image_data_param_);
    this->image_data_param_ = this_16;
  }
  else {
    this->image_data_param_ = (ImageDataParameter *)0x0;
  }
  bVar1 = has_infogain_loss_param(from);
  if (bVar1) {
    this_17 = (InfogainLossParameter *)operator_new(0x20);
    InfogainLossParameter::InfogainLossParameter(this_17,from->infogain_loss_param_);
    this->infogain_loss_param_ = this_17;
  }
  else {
    this->infogain_loss_param_ = (InfogainLossParameter *)0x0;
  }
  bVar1 = has_inner_product_param(from);
  if (bVar1) {
    this_18 = (InnerProductParameter *)operator_new(0x38);
    InnerProductParameter::InnerProductParameter(this_18,from->inner_product_param_);
    this->inner_product_param_ = this_18;
  }
  else {
    this->inner_product_param_ = (InnerProductParameter *)0x0;
  }
  bVar1 = has_lrn_param(from);
  if (bVar1) {
    this_19 = (LRNParameter *)operator_new(0x30);
    LRNParameter::LRNParameter(this_19,from->lrn_param_);
    this->lrn_param_ = this_19;
  }
  else {
    this->lrn_param_ = (LRNParameter *)0x0;
  }
  bVar1 = has_memory_data_param(from);
  if (bVar1) {
    this_20 = (MemoryDataParameter *)operator_new(0x28);
    MemoryDataParameter::MemoryDataParameter(this_20,from->memory_data_param_);
    this->memory_data_param_ = this_20;
  }
  else {
    this->memory_data_param_ = (MemoryDataParameter *)0x0;
  }
  bVar1 = has_mvn_param(from);
  if (bVar1) {
    this_21 = (MVNParameter *)operator_new(0x20);
    MVNParameter::MVNParameter(this_21,from->mvn_param_);
    this->mvn_param_ = this_21;
  }
  else {
    this->mvn_param_ = (MVNParameter *)0x0;
  }
  bVar1 = has_pooling_param(from);
  if (bVar1) {
    this_22 = (PoolingParameter *)operator_new(0x48);
    PoolingParameter::PoolingParameter(this_22,from->pooling_param_);
    this->pooling_param_ = this_22;
  }
  else {
    this->pooling_param_ = (PoolingParameter *)0x0;
  }
  bVar1 = has_power_param(from);
  if (bVar1) {
    this_23 = (PowerParameter *)operator_new(0x28);
    PowerParameter::PowerParameter(this_23,from->power_param_);
    this->power_param_ = this_23;
  }
  else {
    this->power_param_ = (PowerParameter *)0x0;
  }
  bVar1 = has_relu_param(from);
  if (bVar1) {
    this_24 = (ReLUParameter *)operator_new(0x20);
    ReLUParameter::ReLUParameter(this_24,from->relu_param_);
    this->relu_param_ = this_24;
  }
  else {
    this->relu_param_ = (ReLUParameter *)0x0;
  }
  bVar1 = has_sigmoid_param(from);
  if (bVar1) {
    this_25 = (SigmoidParameter *)operator_new(0x20);
    SigmoidParameter::SigmoidParameter(this_25,from->sigmoid_param_);
    this->sigmoid_param_ = this_25;
  }
  else {
    this->sigmoid_param_ = (SigmoidParameter *)0x0;
  }
  bVar1 = has_softmax_param(from);
  if (bVar1) {
    this_26 = (SoftmaxParameter *)operator_new(0x20);
    SoftmaxParameter::SoftmaxParameter(this_26,from->softmax_param_);
    this->softmax_param_ = this_26;
  }
  else {
    this->softmax_param_ = (SoftmaxParameter *)0x0;
  }
  bVar1 = has_slice_param(from);
  if (bVar1) {
    this_27 = (SliceParameter *)operator_new(0x30);
    SliceParameter::SliceParameter(this_27,from->slice_param_);
    this->slice_param_ = this_27;
  }
  else {
    this->slice_param_ = (SliceParameter *)0x0;
  }
  bVar1 = has_tanh_param(from);
  if (bVar1) {
    this_28 = (TanHParameter *)operator_new(0x20);
    TanHParameter::TanHParameter(this_28,from->tanh_param_);
    this->tanh_param_ = this_28;
  }
  else {
    this->tanh_param_ = (TanHParameter *)0x0;
  }
  bVar1 = has_threshold_param(from);
  if (bVar1) {
    this_29 = (ThresholdParameter *)operator_new(0x20);
    ThresholdParameter::ThresholdParameter(this_29,from->threshold_param_);
    this->threshold_param_ = this_29;
  }
  else {
    this->threshold_param_ = (ThresholdParameter *)0x0;
  }
  bVar1 = has_window_data_param(from);
  if (bVar1) {
    this_30 = (WindowDataParameter *)operator_new(0x58);
    WindowDataParameter::WindowDataParameter(this_30,from->window_data_param_);
    this->window_data_param_ = this_30;
  }
  else {
    this->window_data_param_ = (WindowDataParameter *)0x0;
  }
  bVar1 = has_python_param(from);
  if (bVar1) {
    this_31 = (PythonParameter *)operator_new(0x38);
    PythonParameter::PythonParameter(this_31,from->python_param_);
    this->python_param_ = this_31;
  }
  else {
    this->python_param_ = (PythonParameter *)0x0;
  }
  bVar1 = has_prelu_param(from);
  if (bVar1) {
    this_32 = (PReLUParameter *)operator_new(0x28);
    PReLUParameter::PReLUParameter(this_32,from->prelu_param_);
    this->prelu_param_ = this_32;
  }
  else {
    this->prelu_param_ = (PReLUParameter *)0x0;
  }
  bVar1 = has_spp_param(from);
  if (bVar1) {
    this_33 = (SPPParameter *)operator_new(0x28);
    SPPParameter::SPPParameter(this_33,from->spp_param_);
    this->spp_param_ = this_33;
  }
  else {
    this->spp_param_ = (SPPParameter *)0x0;
  }
  bVar1 = has_reshape_param(from);
  if (bVar1) {
    this_34 = (ReshapeParameter *)operator_new(0x28);
    ReshapeParameter::ReshapeParameter(this_34,from->reshape_param_);
    this->reshape_param_ = this_34;
  }
  else {
    this->reshape_param_ = (ReshapeParameter *)0x0;
  }
  bVar1 = has_log_param(from);
  if (bVar1) {
    this_35 = (LogParameter *)operator_new(0x28);
    LogParameter::LogParameter(this_35,from->log_param_);
    this->log_param_ = this_35;
  }
  else {
    this->log_param_ = (LogParameter *)0x0;
  }
  bVar1 = has_flatten_param(from);
  if (bVar1) {
    this_36 = (FlattenParameter *)operator_new(0x20);
    FlattenParameter::FlattenParameter(this_36,from->flatten_param_);
    this->flatten_param_ = this_36;
  }
  else {
    this->flatten_param_ = (FlattenParameter *)0x0;
  }
  bVar1 = has_reduction_param(from);
  if (bVar1) {
    this_37 = (ReductionParameter *)operator_new(0x28);
    ReductionParameter::ReductionParameter(this_37,from->reduction_param_);
    this->reduction_param_ = this_37;
  }
  else {
    this->reduction_param_ = (ReductionParameter *)0x0;
  }
  bVar1 = has_embed_param(from);
  if (bVar1) {
    this_38 = (EmbedParameter *)operator_new(0x38);
    EmbedParameter::EmbedParameter(this_38,from->embed_param_);
    this->embed_param_ = this_38;
  }
  else {
    this->embed_param_ = (EmbedParameter *)0x0;
  }
  bVar1 = has_tile_param(from);
  if (bVar1) {
    this_39 = (TileParameter *)operator_new(0x20);
    TileParameter::TileParameter(this_39,from->tile_param_);
    this->tile_param_ = this_39;
  }
  else {
    this->tile_param_ = (TileParameter *)0x0;
  }
  bVar1 = has_batch_norm_param(from);
  if (bVar1) {
    this_40 = (BatchNormParameter *)operator_new(0x28);
    BatchNormParameter::BatchNormParameter(this_40,from->batch_norm_param_);
    this->batch_norm_param_ = this_40;
  }
  else {
    this->batch_norm_param_ = (BatchNormParameter *)0x0;
  }
  bVar1 = has_elu_param(from);
  if (bVar1) {
    this_41 = (ELUParameter *)operator_new(0x20);
    ELUParameter::ELUParameter(this_41,from->elu_param_);
    this->elu_param_ = this_41;
  }
  else {
    this->elu_param_ = (ELUParameter *)0x0;
  }
  bVar1 = has_bias_param(from);
  if (bVar1) {
    this_42 = (BiasParameter *)operator_new(0x28);
    BiasParameter::BiasParameter(this_42,from->bias_param_);
    this->bias_param_ = this_42;
  }
  else {
    this->bias_param_ = (BiasParameter *)0x0;
  }
  bVar1 = has_scale_param(from);
  if (bVar1) {
    this_43 = (ScaleParameter *)operator_new(0x38);
    ScaleParameter::ScaleParameter(this_43,from->scale_param_);
    this->scale_param_ = this_43;
  }
  else {
    this->scale_param_ = (ScaleParameter *)0x0;
  }
  bVar1 = has_input_param(from);
  if (bVar1) {
    this_44 = (InputParameter *)operator_new(0x30);
    InputParameter::InputParameter(this_44,from->input_param_);
    this->input_param_ = this_44;
  }
  else {
    this->input_param_ = (InputParameter *)0x0;
  }
  bVar1 = has_crop_param(from);
  if (bVar1) {
    this_45 = (CropParameter *)operator_new(0x30);
    CropParameter::CropParameter(this_45,from->crop_param_);
    this->crop_param_ = this_45;
  }
  else {
    this->crop_param_ = (CropParameter *)0x0;
  }
  bVar1 = has_parameter_param(from);
  if (bVar1) {
    this_46 = (ParameterParameter *)operator_new(0x20);
    ParameterParameter::ParameterParameter(this_46,from->parameter_param_);
    this->parameter_param_ = this_46;
  }
  else {
    this->parameter_param_ = (ParameterParameter *)0x0;
  }
  bVar1 = has_recurrent_param(from);
  if (bVar1) {
    this_47 = (RecurrentParameter *)operator_new(0x30);
    RecurrentParameter::RecurrentParameter(this_47,from->recurrent_param_);
    this->recurrent_param_ = this_47;
  }
  else {
    this->recurrent_param_ = (RecurrentParameter *)0x0;
  }
  this->phase_ = from->phase_;
  return;
}

Assistant:

LayerParameter::LayerParameter(const LayerParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      bottom_(from.bottom_),
      top_(from.top_),
      loss_weight_(from.loss_weight_),
      param_(from.param_),
      blobs_(from.blobs_),
      include_(from.include_),
      exclude_(from.exclude_),
      propagate_down_(from.propagate_down_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  type_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_type()) {
    type_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_);
  }
  if (from.has_transform_param()) {
    transform_param_ = new ::caffe::TransformationParameter(*from.transform_param_);
  } else {
    transform_param_ = NULL;
  }
  if (from.has_loss_param()) {
    loss_param_ = new ::caffe::LossParameter(*from.loss_param_);
  } else {
    loss_param_ = NULL;
  }
  if (from.has_accuracy_param()) {
    accuracy_param_ = new ::caffe::AccuracyParameter(*from.accuracy_param_);
  } else {
    accuracy_param_ = NULL;
  }
  if (from.has_argmax_param()) {
    argmax_param_ = new ::caffe::ArgMaxParameter(*from.argmax_param_);
  } else {
    argmax_param_ = NULL;
  }
  if (from.has_concat_param()) {
    concat_param_ = new ::caffe::ConcatParameter(*from.concat_param_);
  } else {
    concat_param_ = NULL;
  }
  if (from.has_contrastive_loss_param()) {
    contrastive_loss_param_ = new ::caffe::ContrastiveLossParameter(*from.contrastive_loss_param_);
  } else {
    contrastive_loss_param_ = NULL;
  }
  if (from.has_convolution_param()) {
    convolution_param_ = new ::caffe::ConvolutionParameter(*from.convolution_param_);
  } else {
    convolution_param_ = NULL;
  }
  if (from.has_data_param()) {
    data_param_ = new ::caffe::DataParameter(*from.data_param_);
  } else {
    data_param_ = NULL;
  }
  if (from.has_dropout_param()) {
    dropout_param_ = new ::caffe::DropoutParameter(*from.dropout_param_);
  } else {
    dropout_param_ = NULL;
  }
  if (from.has_dummy_data_param()) {
    dummy_data_param_ = new ::caffe::DummyDataParameter(*from.dummy_data_param_);
  } else {
    dummy_data_param_ = NULL;
  }
  if (from.has_eltwise_param()) {
    eltwise_param_ = new ::caffe::EltwiseParameter(*from.eltwise_param_);
  } else {
    eltwise_param_ = NULL;
  }
  if (from.has_exp_param()) {
    exp_param_ = new ::caffe::ExpParameter(*from.exp_param_);
  } else {
    exp_param_ = NULL;
  }
  if (from.has_hdf5_data_param()) {
    hdf5_data_param_ = new ::caffe::HDF5DataParameter(*from.hdf5_data_param_);
  } else {
    hdf5_data_param_ = NULL;
  }
  if (from.has_hdf5_output_param()) {
    hdf5_output_param_ = new ::caffe::HDF5OutputParameter(*from.hdf5_output_param_);
  } else {
    hdf5_output_param_ = NULL;
  }
  if (from.has_hinge_loss_param()) {
    hinge_loss_param_ = new ::caffe::HingeLossParameter(*from.hinge_loss_param_);
  } else {
    hinge_loss_param_ = NULL;
  }
  if (from.has_image_data_param()) {
    image_data_param_ = new ::caffe::ImageDataParameter(*from.image_data_param_);
  } else {
    image_data_param_ = NULL;
  }
  if (from.has_infogain_loss_param()) {
    infogain_loss_param_ = new ::caffe::InfogainLossParameter(*from.infogain_loss_param_);
  } else {
    infogain_loss_param_ = NULL;
  }
  if (from.has_inner_product_param()) {
    inner_product_param_ = new ::caffe::InnerProductParameter(*from.inner_product_param_);
  } else {
    inner_product_param_ = NULL;
  }
  if (from.has_lrn_param()) {
    lrn_param_ = new ::caffe::LRNParameter(*from.lrn_param_);
  } else {
    lrn_param_ = NULL;
  }
  if (from.has_memory_data_param()) {
    memory_data_param_ = new ::caffe::MemoryDataParameter(*from.memory_data_param_);
  } else {
    memory_data_param_ = NULL;
  }
  if (from.has_mvn_param()) {
    mvn_param_ = new ::caffe::MVNParameter(*from.mvn_param_);
  } else {
    mvn_param_ = NULL;
  }
  if (from.has_pooling_param()) {
    pooling_param_ = new ::caffe::PoolingParameter(*from.pooling_param_);
  } else {
    pooling_param_ = NULL;
  }
  if (from.has_power_param()) {
    power_param_ = new ::caffe::PowerParameter(*from.power_param_);
  } else {
    power_param_ = NULL;
  }
  if (from.has_relu_param()) {
    relu_param_ = new ::caffe::ReLUParameter(*from.relu_param_);
  } else {
    relu_param_ = NULL;
  }
  if (from.has_sigmoid_param()) {
    sigmoid_param_ = new ::caffe::SigmoidParameter(*from.sigmoid_param_);
  } else {
    sigmoid_param_ = NULL;
  }
  if (from.has_softmax_param()) {
    softmax_param_ = new ::caffe::SoftmaxParameter(*from.softmax_param_);
  } else {
    softmax_param_ = NULL;
  }
  if (from.has_slice_param()) {
    slice_param_ = new ::caffe::SliceParameter(*from.slice_param_);
  } else {
    slice_param_ = NULL;
  }
  if (from.has_tanh_param()) {
    tanh_param_ = new ::caffe::TanHParameter(*from.tanh_param_);
  } else {
    tanh_param_ = NULL;
  }
  if (from.has_threshold_param()) {
    threshold_param_ = new ::caffe::ThresholdParameter(*from.threshold_param_);
  } else {
    threshold_param_ = NULL;
  }
  if (from.has_window_data_param()) {
    window_data_param_ = new ::caffe::WindowDataParameter(*from.window_data_param_);
  } else {
    window_data_param_ = NULL;
  }
  if (from.has_python_param()) {
    python_param_ = new ::caffe::PythonParameter(*from.python_param_);
  } else {
    python_param_ = NULL;
  }
  if (from.has_prelu_param()) {
    prelu_param_ = new ::caffe::PReLUParameter(*from.prelu_param_);
  } else {
    prelu_param_ = NULL;
  }
  if (from.has_spp_param()) {
    spp_param_ = new ::caffe::SPPParameter(*from.spp_param_);
  } else {
    spp_param_ = NULL;
  }
  if (from.has_reshape_param()) {
    reshape_param_ = new ::caffe::ReshapeParameter(*from.reshape_param_);
  } else {
    reshape_param_ = NULL;
  }
  if (from.has_log_param()) {
    log_param_ = new ::caffe::LogParameter(*from.log_param_);
  } else {
    log_param_ = NULL;
  }
  if (from.has_flatten_param()) {
    flatten_param_ = new ::caffe::FlattenParameter(*from.flatten_param_);
  } else {
    flatten_param_ = NULL;
  }
  if (from.has_reduction_param()) {
    reduction_param_ = new ::caffe::ReductionParameter(*from.reduction_param_);
  } else {
    reduction_param_ = NULL;
  }
  if (from.has_embed_param()) {
    embed_param_ = new ::caffe::EmbedParameter(*from.embed_param_);
  } else {
    embed_param_ = NULL;
  }
  if (from.has_tile_param()) {
    tile_param_ = new ::caffe::TileParameter(*from.tile_param_);
  } else {
    tile_param_ = NULL;
  }
  if (from.has_batch_norm_param()) {
    batch_norm_param_ = new ::caffe::BatchNormParameter(*from.batch_norm_param_);
  } else {
    batch_norm_param_ = NULL;
  }
  if (from.has_elu_param()) {
    elu_param_ = new ::caffe::ELUParameter(*from.elu_param_);
  } else {
    elu_param_ = NULL;
  }
  if (from.has_bias_param()) {
    bias_param_ = new ::caffe::BiasParameter(*from.bias_param_);
  } else {
    bias_param_ = NULL;
  }
  if (from.has_scale_param()) {
    scale_param_ = new ::caffe::ScaleParameter(*from.scale_param_);
  } else {
    scale_param_ = NULL;
  }
  if (from.has_input_param()) {
    input_param_ = new ::caffe::InputParameter(*from.input_param_);
  } else {
    input_param_ = NULL;
  }
  if (from.has_crop_param()) {
    crop_param_ = new ::caffe::CropParameter(*from.crop_param_);
  } else {
    crop_param_ = NULL;
  }
  if (from.has_parameter_param()) {
    parameter_param_ = new ::caffe::ParameterParameter(*from.parameter_param_);
  } else {
    parameter_param_ = NULL;
  }
  if (from.has_recurrent_param()) {
    recurrent_param_ = new ::caffe::RecurrentParameter(*from.recurrent_param_);
  } else {
    recurrent_param_ = NULL;
  }
  phase_ = from.phase_;
  // @@protoc_insertion_point(copy_constructor:caffe.LayerParameter)
}